

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSparseResourcesBufferTests.cpp
# Opt level: O1

void __thiscall
vkt::sparse::anon_unknown_0::IndirectBufferTestInstance::initializeBuffers
          (IndirectBufferTestInstance *this)

{
  DeviceDriver *vk;
  VkDevice device;
  VkBuffer obj;
  Allocation *pAVar1;
  VkDeviceSize VVar2;
  Allocation *pAVar3;
  undefined4 *puVar4;
  long lVar5;
  float in_XMM2_Da;
  float in_XMM3_Da;
  Move<vk::Handle<(vk::HandleType)8>_> local_a8;
  deUint64 local_88;
  DeviceInterface *pDStack_80;
  VkDevice local_78;
  VkAllocationCallbacks *pVStack_70;
  Allocation *local_60 [7];
  
  vk = (this->super_DrawGridTestInstance).super_SparseBufferTestInstance.
       super_SparseResourcesBaseInstance.m_deviceDriver.
       super_UniqueBase<vk::DeviceDriver,_de::DefaultDeleter<vk::DeviceDriver>_>.m_data.ptr;
  device = (this->super_DrawGridTestInstance).super_SparseBufferTestInstance.
           super_SparseResourcesBaseInstance.m_logicalDevice.super_RefBase<vk::VkDevice_s_*>.m_data.
           object;
  makeBufferCreateInfo((VkBufferCreateInfo *)local_60,0x60,0x80);
  ::vk::createBuffer(&local_a8,&vk->super_DeviceInterface,device,(VkBufferCreateInfo *)local_60,
                     (VkAllocationCallbacks *)0x0);
  local_78 = local_a8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device;
  pVStack_70 = local_a8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator;
  local_88 = local_a8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal;
  pDStack_80 = local_a8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface;
  local_a8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal = 0;
  local_a8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_a8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_a8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  obj.m_internal =
       (this->m_vertexBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal
  ;
  if (obj.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
              (&(this->m_vertexBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter,
               obj);
  }
  (this->m_vertexBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device =
       local_78;
  (this->m_vertexBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
       pVStack_70;
  (this->m_vertexBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal =
       local_88;
  (this->m_vertexBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface
       = pDStack_80;
  if (local_a8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
              (&local_a8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter,
               (VkBuffer)
               local_a8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal);
  }
  bindBuffer((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_60,
             &vk->super_DeviceInterface,
             (this->super_DrawGridTestInstance).super_SparseBufferTestInstance.
             super_SparseResourcesBaseInstance.m_logicalDevice.super_RefBase<vk::VkDevice_s_*>.
             m_data.object,
             (this->super_DrawGridTestInstance).super_SparseBufferTestInstance.
             super_SparseResourcesBaseInstance.m_allocator.
             super_UniqueBase<vk::Allocator,_de::DefaultDeleter<vk::Allocator>_>.m_data.ptr,
             (VkBuffer)
             (this->m_vertexBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
             m_internal,(MemoryRequirement)0x1);
  pAVar3 = local_60[0];
  local_60[0] = (Allocation *)0x0;
  pAVar1 = (this->m_vertexBufferAlloc).
           super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
  if (pAVar1 != pAVar3) {
    if (pAVar1 != (Allocation *)0x0) {
      (*pAVar1->_vptr_Allocation[1])();
      (this->m_vertexBufferAlloc).
      super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr =
           (Allocation *)0x0;
    }
    (this->m_vertexBufferAlloc).
    super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr = pAVar3;
  }
  if (local_60[0] != (Allocation *)0x0) {
    (**(code **)(*(long *)local_60[0] + 8))();
    local_60[0] = (Allocation *)0x0;
  }
  generateGrid(((this->m_vertexBufferAlloc).
                super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
               m_hostPtr,2.0,-1.0,in_XMM2_Da,1,1,in_XMM3_Da);
  pAVar1 = (this->m_vertexBufferAlloc).
           super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
  ::vk::flushMappedMemoryRange
            (&vk->super_DeviceInterface,
             (this->super_DrawGridTestInstance).super_SparseBufferTestInstance.
             super_SparseResourcesBaseInstance.m_logicalDevice.super_RefBase<vk::VkDevice_s_*>.
             m_data.object,(VkDeviceMemory)(pAVar1->m_memory).m_internal,pAVar1->m_offset,0x60);
  VVar2 = (this->super_DrawGridTestInstance).m_perDrawBufferOffset;
  puVar4 = (undefined4 *)
           ((long)((this->super_DrawGridTestInstance).m_stagingBufferAlloc.
                   super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)
                  ->m_hostPtr + 0xc);
  lVar5 = 0;
  do {
    puVar4[-1] = (int)lVar5;
    *puVar4 = 0;
    *(undefined8 *)(puVar4 + -3) = 0x100000003;
    lVar5 = lVar5 + 3;
    puVar4 = (undefined4 *)((long)puVar4 + VVar2);
  } while (lVar5 == 3);
  return;
}

Assistant:

void initializeBuffers (void)
	{
		// Vertex buffer
		const DeviceInterface&	vk					= getDeviceInterface();
		const VkDeviceSize		vertexBufferSize	= 2 * 3 * sizeof(Vec4);
								m_vertexBuffer		= makeBuffer(vk, getDevice(), makeBufferCreateInfo(vertexBufferSize, VK_BUFFER_USAGE_VERTEX_BUFFER_BIT));
								m_vertexBufferAlloc	= bindBuffer(vk, getDevice(), getAllocator(), *m_vertexBuffer, MemoryRequirement::HostVisible);

		{
			generateGrid(m_vertexBufferAlloc->getHostPtr(), 2.0f, -1.0f, -1.0f, 1, 1);
			flushMappedMemoryRange(vk, getDevice(), m_vertexBufferAlloc->getMemory(), m_vertexBufferAlloc->getOffset(), vertexBufferSize);
		}

		// Indirect buffer
		for (deUint32 chunkNdx = 0u; chunkNdx < 2; ++chunkNdx)
		{
			deUint8* const					pData		= static_cast<deUint8*>(m_stagingBufferAlloc->getHostPtr()) + chunkNdx * m_perDrawBufferOffset;
			VkDrawIndirectCommand* const	pCmdData	= reinterpret_cast<VkDrawIndirectCommand*>(pData);

			pCmdData->firstVertex	= 3u * chunkNdx;
			pCmdData->firstInstance	= 0u;
			pCmdData->vertexCount	= 3u;
			pCmdData->instanceCount	= 1u;
		}
	}